

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O2

int ParseFile_CdnConfig(TCascStorage *hs,void *pvListFile)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *szLineEnd;
  char *szLineBegin;
  char *local_58;
  char *local_50;
  QUERY_KEY *local_48;
  QUERY_KEY *local_40;
  QUERY_KEY *local_38;
  
  local_38 = &hs->PatchArchivesKey;
  local_40 = &hs->PatchArchivesGroup;
  local_48 = &hs->BuildFiles;
  while (sVar3 = ListFile_GetNextLine(pvListFile,&local_50,&local_58), sVar3 != 0) {
    bVar1 = CheckConfigFileVariable
                      (hs,local_50,local_58,"archive-group",LoadQueryKey,&hs->ArchiveGroup);
    if ((((!bVar1) &&
         (bVar1 = CheckConfigFileVariable
                            (hs,local_50,local_58,"archives",LoadQueryKey,&hs->ArchivesKey), !bVar1)
         ) && (bVar1 = CheckConfigFileVariable
                                 (hs,local_50,local_58,"patch-archives",LoadQueryKey,local_38),
              !bVar1)) &&
       (bVar1 = CheckConfigFileVariable
                          (hs,local_50,local_58,"patch-archive-group",LoadQueryKey,local_40), !bVar1
       )) {
      CheckConfigFileVariable(hs,local_50,local_58,"builds",LoadQueryKey,local_48);
    }
  }
  if ((hs->ArchivesKey).pbData == (LPBYTE)0x0) {
    iVar2 = 1000;
  }
  else {
    iVar2 = 1000;
    if ((hs->ArchivesKey).cbData != 0) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int ParseFile_CdnConfig(TCascStorage * hs, void * pvListFile)
{
    const char * szLineBegin;
    const char * szLineEnd;
    int nError = ERROR_SUCCESS;

    // Keep parsing the listfile while there is something in there
    for(;;)
    {
        // Get the next line
        if(!ListFile_GetNextLine(pvListFile, &szLineBegin, &szLineEnd))
            break;

        // CDN key of ARCHIVE-GROUP. Archive-group is actually a very special '.index' file.
        // It is essentially a merger of all .index files, with a structure change
        // When ".index" added after the ARCHIVE-GROUP, we get file name in "indices" folder
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "archive-group", LoadQueryKey, &hs->ArchiveGroup))
            continue;

        // CDN key of all archives. When ".index" added to the string, we get file name in "indices" folder
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "archives", LoadQueryKey, &hs->ArchivesKey))
            continue;

        // CDN keys of patch archives (needs research) 
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "patch-archives", LoadQueryKey, &hs->PatchArchivesKey))
            continue;

        // CDN key of probably the combined patch index file (needs research)
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "patch-archive-group", LoadQueryKey, &hs->PatchArchivesGroup))
            continue;

        // List of build configs this config supports (optional)
        // Points to file: "data\config\%02X\%02X\%s
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "builds", LoadQueryKey, &hs->BuildFiles))
            continue;
    }

    // Check if all required fields are present
    if(hs->ArchivesKey.pbData == NULL || hs->ArchivesKey.cbData == 0)
        return ERROR_BAD_FORMAT;

    return nError;
}